

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Bundle::Encode(Bundle *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 DataSize;
  KOCTET *SerialData;
  pointer this_00;
  pointer pKVar3;
  
  pKVar1 = (this->m_vStreams).
           super__Vector_base<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_vStreams).
                 super__Vector_base<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pKVar1; this_00 = this_00 + 1) {
    SerialData = KDataStream::GetBufferPtr(this_00);
    DataSize = KDataStream::GetBufferSize(this_00);
    KDataStream::CopyFromBuffer(stream,SerialData,DataSize,Big_Endian);
  }
  pKVar2 = (this->m_vRefHeaders).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->m_vRefHeaders).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar2; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_Header6)._vptr_Header6[5])(pKVar3->m_pRef,stream);
  }
  return;
}

Assistant:

void Bundle::Encode( KDataStream & stream ) const
{
    // TODO: Check for 64 bit alignment and pad

    vector<KDataStream>::const_iterator citrObj = m_vStreams.begin();
    vector<KDataStream>::const_iterator citrObjEnd = m_vStreams.end();
    for( ; citrObj != citrObjEnd; ++citrObj )
    {
        stream.CopyFromBuffer( citrObj->GetBufferPtr(), citrObj->GetBufferSize() );
    }

    vector<PduPtr>::const_iterator citrRef = m_vRefHeaders.begin();
    vector<PduPtr>::const_iterator citrRefEnd = m_vRefHeaders.end();
    for( ; citrRef != citrRefEnd; ++citrRef )
    {
        ( *citrRef )->Encode( stream );
    }
}